

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InternalFillFromPrototype
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end,uint32 count)

{
  anon_class_32_4_bca61903 fn;
  BOOL BVar1;
  bool bVar2;
  RecyclableObject *local_38;
  RecyclableObject *prototype;
  uint32 local_28;
  uint32 count_local;
  uint32 end_local;
  uint32 start_local;
  JavascriptArray *srcArray_local;
  JavascriptArray *pJStack_10;
  uint32 dstIndex_local;
  JavascriptArray *dstArray_local;
  
  prototype._4_4_ = count;
  local_28 = end;
  count_local = start;
  _end_local = srcArray;
  srcArray_local._4_4_ = dstIndex;
  pJStack_10 = dstArray;
  local_38 = RecyclableObject::GetPrototype((RecyclableObject *)srcArray);
  while( true ) {
    bVar2 = false;
    if (count_local + prototype._4_4_ != local_28) {
      BVar1 = Js::JavascriptOperators::IsNull(local_38);
      bVar2 = BVar1 == 0;
    }
    if (!bVar2) break;
    fn.start = &count_local;
    fn.dstIndex = (uint32 *)((long)&srcArray_local + 4);
    fn.dstArray = &stack0xfffffffffffffff0;
    fn.count = (uint32 *)((long)&prototype + 4);
    ForEachOwnMissingArrayIndexOfObject<Js::JavascriptArray::InternalFillFromPrototype(Js::JavascriptArray*,unsigned_int,Js::JavascriptArray*,unsigned_int,unsigned_int,unsigned_int)::__0>
              (_end_local,pJStack_10,local_38,count_local,local_28,srcArray_local._4_4_,fn);
    local_38 = RecyclableObject::GetPrototype(local_38);
  }
  return;
}

Assistant:

void JavascriptArray::InternalFillFromPrototype(JavascriptArray *dstArray, uint32 dstIndex, JavascriptArray *srcArray, uint32 start, uint32 end, uint32 count)
    {
        RecyclableObject* prototype = srcArray->GetPrototype();
        while (start + count != end && !JavascriptOperators::IsNull(prototype))
        {
            ForEachOwnMissingArrayIndexOfObject(srcArray, dstArray, prototype, start, end, dstIndex, [&](uint32 index, Var value) {
                uint32 n = dstIndex + (index - start);
                dstArray->SetItem(n, value, PropertyOperation_None);

                count++;
            });

            prototype = prototype->GetPrototype();
        }
    }